

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::set_member_qualified_name
          (Compiler *this,uint32_t type_id,uint32_t index,string *name)

{
  string *psVar1;
  mapped_type *pmVar2;
  mapped_type *pmVar3;
  unsigned_long *puVar4;
  Decoration *pDVar5;
  TypedID<(spirv_cross::Types)0> local_44;
  unsigned_long local_40;
  TypedID<(spirv_cross::Types)0> local_34;
  size_t local_30;
  TypedID<(spirv_cross::Types)0> local_24;
  string *local_20;
  string *name_local;
  uint32_t index_local;
  uint32_t type_id_local;
  Compiler *this_local;
  
  local_20 = name;
  name_local._0_4_ = index;
  name_local._4_4_ = type_id;
  _index_local = this;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_24,type_id);
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->ir).meta,&local_24);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_34,name_local._4_4_);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->ir).meta,&local_34);
  local_30 = VectorView<spirv_cross::Meta::Decoration>::size
                       (&(pmVar3->members).super_VectorView<spirv_cross::Meta::Decoration>);
  local_40 = (ulong)(uint32_t)name_local + 1;
  puVar4 = ::std::max<unsigned_long>(&local_30,&local_40);
  SmallVector<spirv_cross::Meta::Decoration,_0UL>::resize(&pmVar2->members,*puVar4);
  psVar1 = local_20;
  TypedID<(spirv_cross::Types)0>::TypedID(&local_44,name_local._4_4_);
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->ir).meta,&local_44);
  pDVar5 = VectorView<spirv_cross::Meta::Decoration>::operator[]
                     (&(pmVar2->members).super_VectorView<spirv_cross::Meta::Decoration>,
                      (ulong)(uint32_t)name_local);
  ::std::__cxx11::string::operator=((string *)&pDVar5->qualified_alias,(string *)psVar1);
  return;
}

Assistant:

void Compiler::set_member_qualified_name(uint32_t type_id, uint32_t index, const std::string &name)
{
	ir.meta[type_id].members.resize(max(ir.meta[type_id].members.size(), size_t(index) + 1));
	ir.meta[type_id].members[index].qualified_alias = name;
}